

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_ringbuffer.c
# Opt level: O1

ring_buffer_size_t
PaUtil_ReadRingBuffer(PaUtilRingBuffer *rbuf,void *data,ring_buffer_size_t elementCount)

{
  ring_buffer_size_t rVar1;
  void *data2;
  void *data1;
  ring_buffer_size_t size2;
  ring_buffer_size_t size1;
  void *local_50;
  void *local_48;
  long local_40;
  long local_38;
  
  rVar1 = PaUtil_GetRingBufferReadRegions(rbuf,elementCount,&local_48,&local_38,&local_50,&local_40)
  ;
  memcpy(data,local_48,rbuf->elementSizeBytes * local_38);
  if (0 < local_40) {
    memcpy((void *)((long)data + local_38 * rbuf->elementSizeBytes),local_50,
           local_40 * rbuf->elementSizeBytes);
  }
  rbuf->readIndex = rbuf->readIndex + rVar1 & rbuf->bigMask;
  return rVar1;
}

Assistant:

ring_buffer_size_t PaUtil_ReadRingBuffer( PaUtilRingBuffer *rbuf, void *data, ring_buffer_size_t elementCount )
{
    ring_buffer_size_t size1, size2, numRead;
    void *data1, *data2;
    numRead = PaUtil_GetRingBufferReadRegions( rbuf, elementCount, &data1, &size1, &data2, &size2 );
    if( size2 > 0 )
    {
        memcpy( data, data1, size1*rbuf->elementSizeBytes );
        data = ((char *)data) + size1*rbuf->elementSizeBytes;
        memcpy( data, data2, size2*rbuf->elementSizeBytes );
    }
    else
    {
        memcpy( data, data1, size1*rbuf->elementSizeBytes );
    }
    PaUtil_AdvanceRingBufferReadIndex( rbuf, numRead );
    return numRead;
}